

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_custom_callback(void)

{
  int iVar1;
  char *pcVar2;
  _test_data_t data;
  cargo_t cargo;
  char *args [3];
  uint local_38;
  uint local_34;
  cargo_t local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  char *local_18;
  
  iVar1 = cargo_init(&local_30,0,"program");
  if (iVar1 == 0) {
    local_18 = "128x64";
    local_28 = 0x12ab1a;
    uStack_24 = 0;
    uStack_20 = 0x127e2d;
    uStack_1c = 0;
    if (local_30 == (cargo_t)0x0) {
      __assert_fail("ctx",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x127d,"void cargo_set_flags(cargo_t, cargo_flags_t)");
    }
    local_30->flags = CARGO_AUTOCLEAN;
    iVar1 = cargo_add_option(local_30,0,"--alpha","The alpha","c",_test_cb,&local_38);
    if (iVar1 == 0) {
      cargo_parse(local_30,0,1,3,(char **)&local_28);
      printf("%dx%d\n",(ulong)local_38,(ulong)local_34);
      if (local_38 == 0x80) {
        pcVar2 = (char *)0x0;
        if (local_34 != 0x40) {
          pcVar2 = "Height expected to be 128";
        }
      }
      else {
        pcVar2 = "Width expected to be 128";
      }
    }
    else {
      pcVar2 = "Failed to add options";
    }
    cargo_destroy(&local_30);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_custom_callback)
{
    _test_data_t data;
    char *args[] = { "program", "--alpha", "128x64" };

    cargo_set_flags(cargo, CARGO_AUTOCLEAN);

    ret |= cargo_add_option(cargo, 0, "--alpha", "The alpha", "c", _test_cb, &data);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");

    _TEST_CLEANUP();
}